

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O3

void __thiscall
duckdb::CSVSniffer::SniffTypes
          (CSVSniffer *this,DataChunk *data_chunk,CSVStateMachine *state_machine,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *info_sql_types_candidates,idx_t start_idx_detection)

{
  string_t *dummy_val;
  byte *pbVar1;
  LogicalTypeId LVar2;
  LogicalTypeId LVar3;
  uint uVar4;
  ulong uVar5;
  data_ptr_t pdVar6;
  unsigned_long *puVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  reference vector;
  mapped_type *this_00;
  reference pvVar14;
  ulong uVar15;
  CSVBufferManager *pCVar16;
  unsigned_long __n;
  reference pvVar17;
  byte bVar18;
  bool bVar19;
  byte *pbVar20;
  ulong uVar21;
  long lVar22;
  byte *pbVar23;
  LogicalType *this_01;
  pointer this_02;
  byte *pbVar24;
  byte *__s2;
  long lVar25;
  byte *pbVar26;
  string_t value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  ulong local_190;
  key_type local_158;
  string separator;
  value_type cur_top_candidate;
  LogicalType local_c0;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  uVar5 = data_chunk->count;
  local_158 = 0;
  if ((data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (data_chunk->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar19 = false;
    bVar12 = false;
    do {
      vector = vector<duckdb::Vector,_true>::operator[](&data_chunk->data,local_158);
      pdVar6 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      puVar7 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      this_03 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_03->_M_use_count = this_03->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_03->_M_use_count = this_03->_M_use_count + 1;
        }
      }
      this_00 = ::std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)info_sql_types_candidates,&local_158);
      local_190 = start_idx_detection;
      if (start_idx_detection < uVar5) {
        do {
          pvVar14 = vector<duckdb::LogicalType,_true>::back(this_00);
          LogicalType::LogicalType(&cur_top_candidate,pvVar14);
          uVar15 = 1L << ((byte)local_190 & 0x3f);
          dummy_val = (string_t *)(pdVar6 + local_190 * 0x10);
          do {
            if ((ulong)(((long)(this_00->
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ).
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ).
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       ) < 2) break;
            pvVar14 = vector<duckdb::LogicalType,_true>::back(this_00);
            separator._M_dataplus._M_p = (pointer)&separator.field_2;
            separator._M_string_length = 0;
            separator.field_2._M_local_buf[0] = '\0';
            if ((puVar7 == (unsigned_long *)0x0) || ((puVar7[local_190 >> 6] & uVar15) != 0)) {
              uVar4 = (dummy_val->value).pointer.length;
              uVar21 = (ulong)uVar4;
              pbVar26 = pdVar6 + local_190 * 0x10 + 4;
              if (0xc < uVar21) {
                pbVar26 = (byte *)(dummy_val->value).pointer.ptr;
              }
              pbVar1 = pbVar26 + uVar21;
              if (3 < uVar21) {
                lVar22 = (ulong)(uVar4 >> 2) + 1;
                pbVar20 = pbVar26 + 3;
                do {
                  pbVar26 = pbVar20;
                  bVar18 = pbVar26[-3];
                  if ((4 < bVar18 - 9) && (bVar18 != 0x20)) {
                    pbVar26 = pbVar26 + -3;
                    goto LAB_0165bd92;
                  }
                  bVar18 = pbVar26[-2];
                  if ((4 < bVar18 - 9) && (bVar18 != 0x20)) {
                    pbVar26 = pbVar26 + -2;
                    goto LAB_0165bd92;
                  }
                  bVar18 = pbVar26[-1];
                  if ((4 < bVar18 - 9) && (bVar18 != 0x20)) {
                    pbVar26 = pbVar26 + -1;
                    goto LAB_0165bd92;
                  }
                  bVar18 = *pbVar26;
                  if ((4 < bVar18 - 9) && (bVar18 != 0x20)) goto LAB_0165bd92;
                  lVar22 = lVar22 + -1;
                  pbVar20 = pbVar26 + 4;
                } while (1 < lVar22);
                pbVar26 = pbVar26 + 1;
              }
              lVar22 = (long)pbVar1 - (long)pbVar26;
              if (lVar22 == 1) {
LAB_0165bc07:
                bVar18 = *pbVar26;
                if ((bVar18 - 9 < 5) || (bVar18 == 0x20)) goto LAB_0165bc19;
              }
              else if (lVar22 == 2) {
LAB_0165bbf2:
                bVar18 = *pbVar26;
                if ((bVar18 - 9 < 5) || (bVar18 == 0x20)) {
                  pbVar26 = pbVar26 + 1;
                  goto LAB_0165bc07;
                }
              }
              else {
                if (lVar22 != 3) goto LAB_0165bc19;
                bVar18 = *pbVar26;
                if ((bVar18 - 9 < 5) || (bVar18 == 0x20)) {
                  pbVar26 = pbVar26 + 1;
                  goto LAB_0165bbf2;
                }
              }
LAB_0165bd92:
              if ((pbVar26 != pbVar1) && ((byte)(bVar18 - 0x30) < 10)) {
                lVar22 = (long)pbVar1 - (long)pbVar26 >> 2;
                pbVar20 = pbVar26;
                if (0 < lVar22) {
                  pbVar20 = pbVar26 + ((long)pbVar1 - (long)pbVar26 & 0xfffffffffffffffc);
                  lVar22 = lVar22 + 1;
                  pbVar26 = pbVar26 + 3;
                  do {
                    if (9 < (byte)(pbVar26[-3] - 0x30)) {
                      pbVar26 = pbVar26 + -3;
                      goto LAB_0165bec9;
                    }
                    if (9 < (byte)(pbVar26[-2] - 0x30)) {
                      pbVar26 = pbVar26 + -2;
                      goto LAB_0165bec9;
                    }
                    if (9 < (byte)(pbVar26[-1] - 0x30)) {
                      pbVar26 = pbVar26 + -1;
                      goto LAB_0165bec9;
                    }
                    if (9 < (byte)(*pbVar26 - 0x30)) goto LAB_0165bec9;
                    lVar22 = lVar22 + -1;
                    pbVar26 = pbVar26 + 4;
                  } while (1 < lVar22);
                }
                lVar22 = (long)pbVar1 - (long)pbVar20;
                pbVar26 = pbVar20;
                if (lVar22 == 1) {
LAB_0165be5a:
                  if ((byte)(*pbVar26 - 0x30) < 10) goto LAB_0165bc19;
                }
                else if (lVar22 == 2) {
LAB_0165be4c:
                  if ((byte)(*pbVar26 - 0x30) < 10) {
                    pbVar26 = pbVar26 + 1;
                    goto LAB_0165be5a;
                  }
                }
                else {
                  if (lVar22 != 3) goto LAB_0165bc19;
                  if ((byte)(*pbVar20 - 0x30) < 10) {
                    pbVar26 = pbVar20 + 1;
                    goto LAB_0165be4c;
                  }
                }
LAB_0165bec9:
                if (pbVar26 != pbVar1) {
                  lVar22 = (long)pbVar1 - (long)pbVar26 >> 2;
                  pbVar20 = pbVar26;
                  if (0 < lVar22) {
                    pbVar20 = pbVar26 + ((long)pbVar1 - (long)pbVar26 & 0xfffffffffffffffc);
                    lVar22 = lVar22 + 1;
                    pbVar24 = pbVar26 + 3;
                    do {
                      if ((byte)(pbVar24[-3] - 0x30) < 10) {
                        pbVar24 = pbVar24 + -3;
                        goto LAB_0165c07d;
                      }
                      if ((byte)(pbVar24[-2] - 0x30) < 10) {
                        pbVar24 = pbVar24 + -2;
                        goto LAB_0165c07d;
                      }
                      if ((byte)(pbVar24[-1] - 0x30) < 10) {
                        pbVar24 = pbVar24 + -1;
                        goto LAB_0165c07d;
                      }
                      if ((byte)(*pbVar24 - 0x30) < 10) goto LAB_0165c07d;
                      lVar22 = lVar22 + -1;
                      pbVar24 = pbVar24 + 4;
                    } while (1 < lVar22);
                  }
                  lVar22 = (long)pbVar1 - (long)pbVar20;
                  if (lVar22 == 1) {
LAB_0165c06c:
                    pbVar24 = pbVar20;
                    if (9 < (byte)(*pbVar20 - 0x30)) goto LAB_0165bc19;
                  }
                  else if (lVar22 == 2) {
LAB_0165bf7c:
                    pbVar24 = pbVar20;
                    if (9 < (byte)(*pbVar20 - 0x30)) {
                      pbVar20 = pbVar20 + 1;
                      goto LAB_0165c06c;
                    }
                  }
                  else {
                    if (lVar22 != 3) goto LAB_0165bc19;
                    pbVar24 = pbVar20;
                    if (9 < (byte)(*pbVar20 - 0x30)) {
                      pbVar20 = pbVar20 + 1;
                      goto LAB_0165bf7c;
                    }
                  }
LAB_0165c07d:
                  if (pbVar24 != pbVar1) {
                    lVar22 = (long)pbVar1 - (long)pbVar24 >> 2;
                    pbVar20 = pbVar24;
                    if (0 < lVar22) {
                      pbVar20 = pbVar24 + ((long)pbVar1 - (long)pbVar24 & 0xfffffffffffffffc);
                      lVar22 = lVar22 + 1;
                      __s2 = pbVar24 + 3;
                      do {
                        if (9 < (byte)(__s2[-3] - 0x30)) {
                          __s2 = __s2 + -3;
                          goto LAB_0165c19a;
                        }
                        if (9 < (byte)(__s2[-2] - 0x30)) {
                          __s2 = __s2 + -2;
                          goto LAB_0165c19a;
                        }
                        if (9 < (byte)(__s2[-1] - 0x30)) {
                          __s2 = __s2 + -1;
                          goto LAB_0165c19a;
                        }
                        if (9 < (byte)(*__s2 - 0x30)) goto LAB_0165c19a;
                        lVar22 = lVar22 + -1;
                        __s2 = __s2 + 4;
                      } while (1 < lVar22);
                    }
                    lVar22 = (long)pbVar1 - (long)pbVar20;
                    if (lVar22 == 1) {
LAB_0165c136:
                      __s2 = pbVar20;
                      if ((byte)(*pbVar20 - 0x30) < 10) goto LAB_0165bc19;
                    }
                    else if (lVar22 == 2) {
LAB_0165c129:
                      __s2 = pbVar20;
                      if ((byte)(*pbVar20 - 0x30) < 10) {
                        pbVar20 = pbVar20 + 1;
                        goto LAB_0165c136;
                      }
                    }
                    else {
                      if (lVar22 != 3) goto LAB_0165bc19;
                      __s2 = pbVar20;
                      if ((byte)(*pbVar20 - 0x30) < 10) {
                        pbVar20 = pbVar20 + 1;
                        goto LAB_0165c129;
                      }
                    }
LAB_0165c19a:
                    if (__s2 != pbVar1) {
                      lVar22 = (long)pbVar1 - (long)__s2 >> 2;
                      pbVar20 = __s2;
                      if (0 < lVar22) {
                        pbVar20 = __s2 + ((long)pbVar1 - (long)__s2 & 0xfffffffffffffffc);
                        lVar22 = lVar22 + 1;
                        pbVar23 = __s2 + 3;
                        do {
                          if ((byte)(pbVar23[-3] - 0x30) < 10) {
                            pbVar23 = pbVar23 + -3;
                            goto LAB_0165c26a;
                          }
                          if ((byte)(pbVar23[-2] - 0x30) < 10) {
                            pbVar23 = pbVar23 + -2;
                            goto LAB_0165c26a;
                          }
                          if ((byte)(pbVar23[-1] - 0x30) < 10) {
                            pbVar23 = pbVar23 + -1;
                            goto LAB_0165c26a;
                          }
                          if ((byte)(*pbVar23 - 0x30) < 10) goto LAB_0165c26a;
                          lVar22 = lVar22 + -1;
                          pbVar23 = pbVar23 + 4;
                        } while (1 < lVar22);
                      }
                      lVar22 = (long)pbVar1 - (long)pbVar20;
                      if (lVar22 == 1) {
LAB_0165c259:
                        pbVar23 = pbVar20;
                        if (9 < (byte)(*pbVar20 - 0x30)) goto LAB_0165bc19;
                      }
                      else if (lVar22 == 2) {
LAB_0165c236:
                        pbVar23 = pbVar20;
                        if (9 < (byte)(*pbVar20 - 0x30)) {
                          pbVar20 = pbVar20 + 1;
                          goto LAB_0165c259;
                        }
                      }
                      else {
                        if (lVar22 != 3) goto LAB_0165bc19;
                        pbVar23 = pbVar20;
                        if (9 < (byte)(*pbVar20 - 0x30)) {
                          pbVar20 = pbVar20 + 1;
                          goto LAB_0165c236;
                        }
                      }
LAB_0165c26a:
                      if ((pbVar23 != pbVar1) &&
                         (lVar22 = (long)pbVar23 - (long)__s2,
                         lVar22 == (long)pbVar24 - (long)pbVar26)) {
                        __n = NumericCastImpl<unsigned_long,_long,_false>::Convert(lVar22);
                        iVar13 = strncmp((char *)pbVar26,(char *)__s2,__n);
                        if (iVar13 == 0) {
                          separator._M_string_length = 0;
                          *separator._M_dataplus._M_p = '\0';
                          if (pbVar26 < pbVar24) {
                            lVar25 = 0;
                            do {
                              if (pbVar26[lVar25] == 0x25) {
                                ::std::__cxx11::string::push_back((char)&separator);
                              }
                              ::std::__cxx11::string::push_back((char)&separator);
                              lVar25 = lVar25 + 1;
                            } while (lVar22 != lVar25);
                          }
                          pvVar17 = vector<duckdb::LogicalType,_true>::back(this_00);
                          if ((pvVar17->id_ == TIMESTAMP && !bVar19) ||
                             (pvVar17 = vector<duckdb::LogicalType,_true>::back(this_00),
                             pvVar17->id_ == DATE && !bVar12)) {
                            DetectDateAndTimeStampFormats
                                      (this,state_machine,pvVar14,&separator,dummy_val);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
LAB_0165bc19:
            LogicalType::LogicalType(&local_78,VARCHAR);
            bVar8 = LogicalType::operator==(pvVar14,&local_78);
            LogicalType::~LogicalType(&local_78);
            if (bVar8) {
LAB_0165bce5:
              bVar8 = false;
            }
            else {
              pCVar16 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                                  (&this->buffer_manager);
              if (puVar7 == (unsigned_long *)0x0) {
                bVar8 = false;
              }
              else {
                bVar8 = (puVar7[local_190 >> 6] & uVar15) == 0;
              }
              value.value.pointer.ptr = (char *)pvVar14;
              value.value._0_8_ = (dummy_val->value).pointer.ptr;
              bVar9 = CanYouCastIt((CSVSniffer *)pCVar16->context,
                                   *(ClientContext **)&dummy_val->value,value,
                                   (LogicalType *)&state_machine->dialect_options,
                                   (DialectOptions *)(ulong)bVar8,
                                   (bool)*(state_machine->options->decimal_separator)._M_dataplus.
                                          _M_p,state_machine->options->thousands_separator,
                                   (char)this_03);
              bVar8 = true;
              if (!bVar9) {
                if (local_190 == start_idx_detection) {
LAB_0165bcd4:
                  this_01 = (this_00->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  (this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = this_01;
                  LogicalType::~LogicalType(this_01);
                  goto LAB_0165bce5;
                }
                LogicalType::LogicalType(&local_78,BOOLEAN);
                bVar9 = LogicalType::operator==(&cur_top_candidate,&local_78);
                this_02 = &local_78;
                if (!bVar9) {
                  LogicalType::LogicalType(&local_c0,DATE);
                  bVar9 = LogicalType::operator==(&cur_top_candidate,&local_c0);
                  if (!bVar9) {
                    LogicalType::LogicalType(&local_90,TIME);
                    bVar9 = LogicalType::operator==(&cur_top_candidate,&local_90);
                    if (!bVar9) {
                      LogicalType::LogicalType(&local_a8,TIMESTAMP);
                      bVar9 = LogicalType::operator==(&cur_top_candidate,&local_a8);
                      if (bVar9) {
                        pvVar14 = vector<duckdb::LogicalType,_true>::operator[]
                                            (this_00,((long)(this_00->
                                                                                                                        
                                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ).
                                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this_00->
                                                                                                                
                                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ).
                                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                                  -0x5555555555555555 - 2);
                        LogicalType::LogicalType(&local_60,TIMESTAMP_TZ);
                        bVar10 = LogicalType::operator==(pvVar14,&local_60);
                        bVar11 = true;
                        if (bVar10) goto LAB_0165c00d;
LAB_0165c046:
                        LogicalType::~LogicalType(&local_60);
                      }
                      else {
LAB_0165c00d:
                        LogicalType::LogicalType(&local_48,TIMESTAMP_TZ);
                        bVar11 = LogicalType::operator==(&cur_top_candidate,&local_48);
                        LogicalType::~LogicalType(&local_48);
                        if (bVar9) goto LAB_0165c046;
                      }
                      LogicalType::~LogicalType(&local_a8);
                      LogicalType::~LogicalType(&local_90);
                      LogicalType::~LogicalType(&local_c0);
                      LogicalType::~LogicalType(&local_78);
                      if (bVar11 != false) goto LAB_0165c343;
                      goto LAB_0165bcd4;
                    }
                    LogicalType::~LogicalType(&local_90);
                  }
                  LogicalType::~LogicalType(&local_c0);
                }
                while( true ) {
                  LogicalType::~LogicalType(this_02);
LAB_0165c343:
                  pvVar14 = vector<duckdb::LogicalType,_true>::back(this_00);
                  LogicalType::LogicalType(&local_78,VARCHAR);
                  bVar9 = LogicalType::operator==(pvVar14,&local_78);
                  LogicalType::~LogicalType(&local_78);
                  if (bVar9) break;
                  this_02 = (this_00->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1;
                  (this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish = this_02;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)separator._M_dataplus._M_p != &separator.field_2) {
              operator_delete(separator._M_dataplus._M_p);
            }
          } while (!bVar8);
          LogicalType::~LogicalType(&cur_top_candidate);
          local_190 = local_190 + 1;
        } while (local_190 != uVar5);
      }
      pvVar14 = vector<duckdb::LogicalType,_true>::back(this_00);
      LVar2 = pvVar14->id_;
      pvVar14 = vector<duckdb::LogicalType,_true>::back(this_00);
      LVar3 = pvVar14->id_;
      if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
      }
      bVar12 = (bool)(bVar12 | LVar2 == DATE);
      local_158 = local_158 + 1;
      bVar19 = (bool)(bVar19 | LVar3 == TIMESTAMP);
    } while (local_158 <
             (ulong)(((long)(data_chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(data_chunk->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void CSVSniffer::SniffTypes(DataChunk &data_chunk, CSVStateMachine &state_machine,
                            unordered_map<idx_t, vector<LogicalType>> &info_sql_types_candidates,
                            idx_t start_idx_detection) {
	const idx_t chunk_size = data_chunk.size();
	HasType has_type;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		D_ASSERT(cur_vector.GetVectorType() == VectorType::FLAT_VECTOR);
		D_ASSERT(cur_vector.GetType() == LogicalType::VARCHAR);
		auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto null_mask = FlatVector::Validity(cur_vector);
		auto &col_type_candidates = info_sql_types_candidates[col_idx];
		for (idx_t row_idx = start_idx_detection; row_idx < chunk_size; row_idx++) {
			// col_type_candidates can't be empty since anything in a CSV file should at least be a string
			// and we validate utf-8 compatibility when creating the type
			D_ASSERT(!col_type_candidates.empty());
			auto cur_top_candidate = col_type_candidates.back();
			// try cast from string to sql_type
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				// try formatting for date types if the user did not specify one, and it starts with numeric
				// values.
				string separator;
				// If Value is not Null, Has a numeric date format, and the current investigated candidate is
				// either a timestamp or a date
				if (null_mask.RowIsValid(row_idx) && StartsWithNumericDate(separator, vector_data[row_idx]) &&
				    ((col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP && !has_type.timestamp) ||
				     (col_type_candidates.back().id() == LogicalTypeId::DATE && !has_type.date))) {
					DetectDateAndTimeStampFormats(state_machine, sql_type, separator, vector_data[row_idx]);
				}
				// try cast from string to sql_type
				if (sql_type == LogicalType::VARCHAR) {
					// Nothing to convert it to
					continue;
				}
				if (CanYouCastIt(buffer_manager->context, vector_data[row_idx], sql_type, state_machine.dialect_options,
				                 !null_mask.RowIsValid(row_idx), state_machine.options.decimal_separator[0],
				                 state_machine.options.thousands_separator)) {
					break;
				}
				D_ASSERT(cur_top_candidate.id() == LogicalTypeId::VARCHAR || col_type_candidates.size() > 1);
				if (row_idx != start_idx_detection &&
				    (cur_top_candidate == LogicalType::BOOLEAN || cur_top_candidate == LogicalType::DATE ||
				     cur_top_candidate == LogicalType::TIME ||
				     (cur_top_candidate == LogicalType::TIMESTAMP &&
				      col_type_candidates[col_type_candidates.size() - 2] != LogicalType::TIMESTAMP_TZ) ||
				     cur_top_candidate == LogicalType::TIMESTAMP_TZ)) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		if (col_type_candidates.back().id() == LogicalTypeId::DATE) {
			has_type.date = true;
		}
		if (col_type_candidates.back().id() == LogicalTypeId::TIMESTAMP) {
			has_type.timestamp = true;
		}
	}
}